

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

ExpEmit __thiscall FxVectorBuiltin::Emit(FxVectorBuiltin *this,VMFunctionBuilder *build)

{
  byte bVar1;
  byte bVar2;
  PType *pPVar3;
  uint uVar4;
  uint uVar5;
  ExpEmit EVar6;
  ExpEmit EVar7;
  int iVar8;
  ExpEmit op;
  ExpEmit len;
  undefined4 extraout_var;
  
  pPVar3 = (this->super_FxExpression).ValueType;
  bVar1 = pPVar3->RegType;
  bVar2 = pPVar3->RegCount;
  uVar4 = VMFunctionBuilder::RegAvailability::Get(build->Registers + bVar1,(uint)bVar2);
  EVar6._0_4_ = (*this->Self->_vptr_FxExpression[9])(this->Self,build);
  EVar6.Konst = (bool)(char)extraout_var;
  EVar6.Fixed = (bool)(char)((uint)extraout_var >> 8);
  EVar6.Final = (bool)(char)((uint)extraout_var >> 0x10);
  EVar6.Target = (bool)(char)((uint)extraout_var >> 0x18);
  op = EVar6;
  if ((this->Function).Index == 0x279) {
    iVar8 = 0xc9;
    if ((PStruct *)this->Self->ValueType == TypeVector2) {
      iVar8 = 0xbd;
    }
    VMFunctionBuilder::Emit(build,iVar8,uVar4 & 0xffff,(VM_SHALF)EVar6._0_4_);
  }
  else {
    uVar5 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 1,1);
    len.RegNum = (uint16_t)uVar5;
    len.RegType = '\x01';
    len.RegCount = '\x01';
    len.Konst = false;
    len.Fixed = false;
    len.Final = false;
    len.Target = false;
    iVar8 = 0xc9;
    if ((PStruct *)this->Self->ValueType == TypeVector2) {
      iVar8 = 0xbd;
    }
    VMFunctionBuilder::Emit(build,iVar8,uVar5 & 0xffff,(VM_SHALF)EVar6._0_4_);
    iVar8 = 199;
    if ((PStruct *)this->Self->ValueType == TypeVector2) {
      iVar8 = 0xbb;
    }
    VMFunctionBuilder::Emit(build,iVar8,uVar4 & 0xffff,EVar6._0_4_ & 0xffff,uVar5 & 0xffff);
    ExpEmit::Free(&len,build);
  }
  ExpEmit::Free(&op,build);
  EVar7._0_4_ = (uint)bVar1 << 0x10 | (uint)bVar2 << 0x18 | uVar4 & 0xffff;
  EVar7.Konst = false;
  EVar7.Fixed = false;
  EVar7.Final = false;
  EVar7.Target = false;
  return EVar7;
}

Assistant:

ExpEmit FxVectorBuiltin::Emit(VMFunctionBuilder *build)
{
	ExpEmit to(build, ValueType->GetRegType(), ValueType->GetRegCount());
	ExpEmit op = Self->Emit(build);
	if (Function == NAME_Length)
	{
		build->Emit(Self->ValueType == TypeVector2 ? OP_LENV2 : OP_LENV3, to.RegNum, op.RegNum);
	}
	else
	{
		ExpEmit len(build, REGT_FLOAT);
		build->Emit(Self->ValueType == TypeVector2 ? OP_LENV2 : OP_LENV3, len.RegNum, op.RegNum);
		build->Emit(Self->ValueType == TypeVector2 ? OP_DIVVF2_RR : OP_DIVVF3_RR, to.RegNum, op.RegNum, len.RegNum);
		len.Free(build);
	}
	op.Free(build);
	return to;
}